

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HullFinder.cpp
# Opt level: O0

SelectionSet * __thiscall OpenMD::HullFinder::findHull(HullFinder *this,int param_2)

{
  undefined4 in_EDX;
  SelectionSet *in_RSI;
  SelectionSet *in_RDI;
  SelectionSet *ssResult;
  SelectionSet *this_00;
  uint3 in_stack_ffffffffffffffe8;
  uint uVar1;
  
  uVar1 = (uint)in_stack_ffffffffffffffe8;
  this_00 = in_RDI;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_RSI,
             (vector<int,_std::allocator<int>_> *)CONCAT44(in_EDX,uVar1));
  SelectionSet::SelectionSet(in_RSI,(vector<int,_std::allocator<int>_> *)CONCAT44(in_EDX,uVar1));
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
  snprintf(painCave.errMsg,2000,
           "HullFinder : Hull calculation is not possible without libqhull.\n\tPlease rebuild OpenMD with qhull enabled."
          );
  painCave.severity = 1;
  painCave.isFatal = 1;
  simError();
  return in_RDI;
}

Assistant:

SelectionSet HullFinder::findHull(int) {
    SelectionSet ssResult(nObjects_);
#ifdef HAVE_QHULL
    surfaceMesh_->computeHull(localSites_);
    std::vector<Triangle> sMesh = surfaceMesh_->getMesh();
    // Loop over the mesh faces
    std::vector<Triangle>::iterator face;
    std::vector<StuntDouble*>::iterator vertex;

    // This will work in parallel because the triangles returned by the mesh
    // have a NULL stuntDouble if this processor doesn't own the

    for (face = sMesh.begin(); face != sMesh.end(); ++face) {
      Triangle thisTriangle               = *face;
      std::vector<StuntDouble*> vertexSDs = thisTriangle.getVertices();
      for (vertex = vertexSDs.begin(); vertex != vertexSDs.end(); ++vertex) {
        if ((*vertex) != NULL) {
          ssResult.bitsets_[STUNTDOUBLE].setBitOn((*vertex)->getGlobalIndex());
        }
      }
    }
    surfaceArea_ = surfaceMesh_->getArea();
    volume_      = surfaceMesh_->getVolume();

#else
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "HullFinder : Hull calculation is not possible without libqhull.\n"
             "\tPlease rebuild OpenMD with qhull enabled.");
    painCave.severity = OPENMD_ERROR;
    painCave.isFatal  = 1;
    simError();
#endif

    return ssResult;
  }